

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O0

Maj_Man_t_conflict *
Maj_ManAlloc(int nVars,int nNodes,int fUseConst,int fUseLine,int fUseRand,int nRands,int fVerbose)

{
  int iVar1;
  Maj_Man_t_conflict *p_00;
  Vec_Wec_t *pVVar2;
  Vec_Wrd_t *pVVar3;
  sat_solver *psVar4;
  Maj_Man_t_conflict *p;
  int nRands_local;
  int fUseRand_local;
  int fUseLine_local;
  int fUseConst_local;
  int nNodes_local;
  int nVars_local;
  
  p_00 = (Maj_Man_t_conflict *)calloc(1,0x30c8);
  p_00->nVars = nVars;
  p_00->nNodes = nNodes;
  p_00->nObjs = nVars + 2 + nNodes;
  p_00->fUseConst = fUseConst;
  p_00->fUseLine = fUseLine;
  p_00->fUseRand = fUseRand;
  p_00->fVerbose = fVerbose;
  p_00->nRands = nRands;
  iVar1 = Abc_TtWordNum(nVars);
  p_00->nWords = iVar1;
  pVVar2 = Vec_WecStart(p_00->nObjs);
  p_00->vOutLits = pVVar2;
  iVar1 = Maj_ManMarkup(p_00);
  p_00->iVar = iVar1;
  p_00->VarVals[1] = 1;
  pVVar3 = Maj_ManTruthTables(p_00);
  p_00->vInfo = pVVar3;
  psVar4 = sat_solver_new();
  p_00->pSat = psVar4;
  sat_solver_setnvars(p_00->pSat,p_00->iVar);
  return p_00;
}

Assistant:

static Maj_Man_t * Maj_ManAlloc( int nVars, int nNodes, int fUseConst, int fUseLine, int fUseRand, int nRands, int fVerbose )
{
    Maj_Man_t * p = ABC_CALLOC( Maj_Man_t, 1 );
    p->nVars      = nVars;
    p->nNodes     = nNodes;
    p->nObjs      = 2 + nVars + nNodes;
    p->fUseConst  = fUseConst;
    p->fUseLine   = fUseLine;
    p->fUseRand   = fUseRand;
    p->fVerbose   = fVerbose;
    p->nRands     = nRands;
    p->nWords     = Abc_TtWordNum(nVars);
    p->vOutLits   = Vec_WecStart( p->nObjs );
    p->iVar       = Maj_ManMarkup( p );
    p->VarVals[1] = 1;
    p->vInfo      = Maj_ManTruthTables( p );
    p->pSat       = sat_solver_new();
    sat_solver_setnvars( p->pSat, p->iVar );
    return p;
}